

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_test.cpp
# Opt level: O3

void __thiscall FFT_Benchmark1e4_Test::~FFT_Benchmark1e4_Test(FFT_Benchmark1e4_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(FFT, Benchmark1e4) {
    int n = 1e4;
    int range = 1e5; //numbers from -range to range
    vector<ll> p1(n), p2(n);
    rep(j, 0, p1.size()) p1[j] = rand() % (2 * range) - range;
    rep(j, 0, p2.size()) p2[j] = rand() % (2 * range) - range;
    vector<ll> res = multiplyPolynomials(p1, p2);
    p1.resize(10), p2.resize(10);
    vector<ll> want = multiplyNaive(p1, p2);
    want.resize(10), res.resize(10);
    EXPECT_EQ(want, res);
}